

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_msl_resource_binding(CompilerMSL *this,MSLResourceBinding *binding)

{
  BaseType BVar1;
  mapped_type mVar2;
  uint32_t uVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  CompilerError *this_00;
  StageSetBinding arg_idx_tuple;
  undefined1 local_58 [12];
  uint32_t uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  key_type local_2c;
  
  local_2c.model = binding->stage;
  local_2c.desc_set = binding->desc_set;
  local_2c.binding = binding->binding;
  local_58._0_4_ = binding->stage;
  local_58._4_4_ = binding->basetype;
  local_58._8_4_ = binding->desc_set;
  uStack_4c = binding->binding;
  local_48._0_4_ = binding->count;
  local_48._4_4_ = binding->msl_buffer;
  uStack_40._0_4_ = binding->msl_texture;
  uStack_40._4_4_ = binding->msl_sampler;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->resource_bindings,&local_2c);
  (pmVar4->first).stage = local_58._0_4_;
  (pmVar4->first).basetype = local_58._4_4_;
  (pmVar4->first).desc_set = local_58._8_4_;
  (pmVar4->first).binding = uStack_4c;
  (pmVar4->first).count = (uint32_t)local_48;
  (pmVar4->first).msl_buffer = local_48._4_4_;
  (pmVar4->first).msl_texture = (uint32_t)uStack_40;
  (pmVar4->first).msl_sampler = uStack_40._4_4_;
  pmVar4->second = false;
  if ((this->msl_options).pad_argument_buffer_resources != true) {
    return;
  }
  local_58._4_4_ = binding->desc_set;
  local_58._0_4_ = binding->stage;
  stack0xffffffffffffffb0 = CONCAT44(uStack_4c,0xffffffff);
  BVar1 = binding->basetype;
  if (BVar1 - Void < 0xe) {
    uVar3 = binding->msl_buffer;
  }
  else if (BVar1 == Image) {
    uVar3 = binding->msl_texture;
  }
  else {
    if (BVar1 == SampledImage) {
      local_58._8_4_ = binding->msl_texture;
      mVar2 = binding->binding;
      pmVar5 = ::std::__detail::
               _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->resource_arg_buff_idx_to_binding_number,(key_type *)local_58);
      *pmVar5 = mVar2;
      stack0xffffffffffffffb0 = CONCAT44(uStack_4c,binding->msl_sampler);
      goto LAB_00207f47;
    }
    if (BVar1 != Sampler) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Unexpected argument buffer resource base type. When padding argument buffer elements, all descriptor set resources must be supplied with a base type by the app."
                );
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = binding->msl_sampler;
  }
  stack0xffffffffffffffb0 = CONCAT44(uStack_4c,uVar3);
LAB_00207f47:
  mVar2 = binding->binding;
  pmVar5 = ::std::__detail::
           _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->resource_arg_buff_idx_to_binding_number,(key_type *)local_58);
  *pmVar5 = mVar2;
  return;
}

Assistant:

void CompilerMSL::add_msl_resource_binding(const MSLResourceBinding &binding)
{
	StageSetBinding tuple = { binding.stage, binding.desc_set, binding.binding };
	resource_bindings[tuple] = { binding, false };

	// If we might need to pad argument buffer members to positionally align
	// arg buffer indexes, also maintain a lookup by argument buffer index.
	if (msl_options.pad_argument_buffer_resources)
	{
		StageSetBinding arg_idx_tuple = { binding.stage, binding.desc_set, k_unknown_component };

#define ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(rez) \
	arg_idx_tuple.binding = binding.msl_##rez; \
	resource_arg_buff_idx_to_binding_number[arg_idx_tuple] = binding.binding

		switch (binding.basetype)
		{
		case SPIRType::Void:
		case SPIRType::Boolean:
		case SPIRType::SByte:
		case SPIRType::UByte:
		case SPIRType::Short:
		case SPIRType::UShort:
		case SPIRType::Int:
		case SPIRType::UInt:
		case SPIRType::Int64:
		case SPIRType::UInt64:
		case SPIRType::AtomicCounter:
		case SPIRType::Half:
		case SPIRType::Float:
		case SPIRType::Double:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(buffer);
			break;
		case SPIRType::Image:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			break;
		case SPIRType::Sampler:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		case SPIRType::SampledImage:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		default:
			SPIRV_CROSS_THROW("Unexpected argument buffer resource base type. When padding argument buffer elements, "
			                  "all descriptor set resources must be supplied with a base type by the app.");
		}
#undef ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP
	}
}